

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFastHuf.cpp
# Opt level: O0

void __thiscall
Imf_2_5::FastHufDecoder::decode
          (FastHufDecoder *this,uchar *src,int numSrcBits,unsigned_short *dst,int numDstElems)

{
  bool bVar1;
  uint uVar2;
  InputExc *pIVar3;
  ulong uVar4;
  long in_RCX;
  int in_EDX;
  byte *in_RSI;
  FastHufDecoder *in_RDI;
  int in_R8D;
  int i;
  int rleCount;
  Int64 id;
  int tableIdx;
  int symbol;
  int codeLen;
  int dstIdx;
  int bufferBackNumBits;
  Int64 bufferBack;
  int bufferNumBits;
  Int64 buffer;
  uchar *currByte;
  int local_70;
  int local_58;
  uint local_54;
  int local_50;
  int local_4c;
  ulong local_48;
  int local_3c;
  ulong local_38;
  byte *local_30;
  int local_24;
  long local_20;
  int local_14 [5];
  
  if (in_EDX < 0x80) {
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc
              (pIVar3,"Error choosing Huffman decoder implementation (insufficient number of bits)."
              );
    __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  local_30 = in_RSI + 0x10;
  local_14[0] = in_EDX + -0x80;
  local_38 = (ulong)*in_RSI << 0x38 | (ulong)in_RSI[1] << 0x30 | (ulong)in_RSI[2] << 0x28 |
             (ulong)in_RSI[3] << 0x20 | (ulong)in_RSI[4] << 0x18 | (ulong)in_RSI[5] << 0x10 |
             (ulong)in_RSI[6] << 8 | (ulong)in_RSI[7];
  local_3c = 0x40;
  local_48 = (ulong)in_RSI[8] << 0x38 | (ulong)in_RSI[9] << 0x30 | (ulong)in_RSI[10] << 0x28 |
             (ulong)in_RSI[0xb] << 0x20 | (ulong)in_RSI[0xc] << 0x18 | (ulong)in_RSI[0xd] << 0x10 |
             (ulong)in_RSI[0xe] << 8 | (ulong)in_RSI[0xf];
  local_4c = 0x40;
  local_50 = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  do {
    if (local_24 <= local_50) {
      if (local_14[0] == 0) {
        return;
      }
      pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc
                (pIVar3,
                 "Huffman decode error (Compressed data remains after filling expected output buffer)."
                );
      __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    if (local_38 < in_RDI->_tableMin) {
      if (local_3c < 0x40) {
        refill(in_RDI,&local_38,0x40 - local_3c,&local_48,&local_4c,&local_30,local_14);
        local_3c = 0x40;
      }
      local_54 = 0xd;
      while( true ) {
        bVar1 = false;
        if (local_38 < in_RDI->_ljBase[(int)local_54]) {
          bVar1 = (int)local_54 <= (int)(uint)in_RDI->_maxCodeLength;
        }
        if (!bVar1) break;
        local_54 = local_54 + 1;
      }
      if ((int)(uint)in_RDI->_maxCodeLength < (int)local_54) {
        pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar3,"Huffman decode error (Decoded an invalid symbol).");
        __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      uVar4 = in_RDI->_ljOffset[(int)local_54] + (local_38 >> (0x40U - (char)local_54 & 0x3f));
      if ((ulong)(long)in_RDI->_numSymbols <= uVar4) {
        pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar3,"Huffman decode error (Decoded an invalid symbol).");
        __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      local_58 = in_RDI->_idToSymbol[uVar4];
    }
    else {
      uVar2 = (uint)(local_38 >> 0x34);
      local_54 = (uint)in_RDI->_tableCodeLen[(int)uVar2];
      local_58 = in_RDI->_tableSymbol[(int)uVar2];
    }
    local_38 = local_38 << ((byte)local_54 & 0x3f);
    local_3c = local_3c - local_54;
    if (local_58 == in_RDI->_rleSymbol) {
      if (local_3c < 8) {
        refill(in_RDI,&local_38,0x40 - local_3c,&local_48,&local_4c,&local_30,local_14);
        local_3c = 0x40;
      }
      uVar2 = (uint)(byte)(local_38 >> 0x38);
      if (local_50 < 1) {
        pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc
                  (pIVar3,"Huffman decode error (RLE code with no previous symbol).");
        __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (local_24 < (int)(local_50 + uVar2)) {
        pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc
                  (pIVar3,"Huffman decode error (Symbol run beyond expected output buffer length).")
        ;
        __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (uVar2 == 0) {
        pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar3,"Huffman decode error (Invalid RLE length)");
        __cxa_throw(pIVar3,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      for (local_70 = 0; local_70 < (int)uVar2; local_70 = local_70 + 1) {
        *(undefined2 *)(local_20 + (long)(local_50 + local_70) * 2) =
             *(undefined2 *)(local_20 + (long)(local_50 + -1) * 2);
      }
      local_50 = uVar2 + local_50;
      local_38 = local_38 << 8;
      local_3c = local_3c + -8;
    }
    else {
      *(short *)(local_20 + (long)local_50 * 2) = (short)local_58;
      local_50 = local_50 + 1;
    }
    if (local_3c < 0xc) {
      refill(in_RDI,&local_38,0x40 - local_3c,&local_48,&local_4c,&local_30,local_14);
      local_3c = 0x40;
    }
  } while( true );
}

Assistant:

void
FastHufDecoder::decode
    (const unsigned char *src,
     int numSrcBits,
     unsigned short *dst, 
     int numDstElems)
{
    if (numSrcBits < 128)
        throw IEX_NAMESPACE::InputExc ("Error choosing Huffman decoder implementation "
                                       "(insufficient number of bits).");

    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //

    const unsigned char *currByte = src + 2 * sizeof (Int64);

    numSrcBits -= 8 * 2 * sizeof (Int64);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    Int64 buffer            = READ64 (src); 
    int   bufferNumBits     = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    Int64 bufferBack        = READ64 ((src + sizeof (Int64))); 
    int   bufferBackNumBits = 64;

    int dstIdx = 0;

    while (dstIdx < numDstElems)
    {
        int  codeLen;
        int  symbol;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (_tableMin <= buffer)
        {
            int tableIdx = buffer >> (64 - TABLE_LOOKUP_BITS);

            // 
            // For invalid codes, _tableCodeLen[] should return 0. This
            // will cause the decoder to get stuck in the current spot
            // until we run out of elements, then barf that the codestream
            // is bad.  So we don't need to stick a condition like
            //     if (codeLen > _maxCodeLength) in this inner.
            //

            codeLen = _tableCodeLen[tableIdx];
            symbol  = _tableSymbol[tableIdx];
        }
        else
        {
            if (bufferNumBits < 64)
            {
                refill (buffer,
                        64 - bufferNumBits,
                        bufferBack,
                        bufferBackNumBits,
                        currByte,
                        numSrcBits);

                bufferNumBits = 64;
            }

            // 
            // Brute force search: 
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            while (_ljBase[codeLen] > buffer && codeLen <= _maxCodeLength)
                codeLen++;

            if (codeLen > _maxCodeLength)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }

            Int64 id = _ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (id < static_cast<Int64>(_numSymbols))
            {
                symbol = _idToSymbol[id];
            }
            else
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error "
                                               "(Decoded an invalid symbol).");
            }
        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we recieved a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == _rleSymbol)
        {
            if (bufferNumBits < 8)
            {
                refill (buffer,
                        64 - bufferNumBits,
                        bufferBack,
                        bufferBackNumBits,
                        currByte,
                        numSrcBits);

                bufferNumBits = 64;
            }

            int rleCount = buffer >> 56;

            if (dstIdx < 1)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (RLE code "
                                               "with no previous symbol).");
            }

            if (dstIdx + rleCount > numDstElems)
            {
                throw IEX_NAMESPACE::InputExc ("Huffman decode error (Symbol run "
                                               "beyond expected output buffer length).");
            }

            if (rleCount <= 0) 
            {
                throw IEX_NAMESPACE::InputExc("Huffman decode error"
                                              " (Invalid RLE length)");
            }

            for (int i = 0; i < rleCount; ++i)
                dst[dstIdx + i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of 
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            refill (buffer,
                    64 - bufferNumBits,
                    bufferBack,
                    bufferBackNumBits,
                    currByte,
                    numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (numSrcBits != 0)
    {
        throw IEX_NAMESPACE::InputExc ("Huffman decode error (Compressed data remains "
                                       "after filling expected output buffer).");
    }
}